

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * kj::Path::parseWin32Api(Path *__return_storage_ptr__,ArrayPtr<const_wchar_t> text)

{
  size_t count;
  size_t extraout_RDX;
  Path *this;
  undefined1 in_R9B;
  StringPtr path;
  StringPtr path_00;
  ArrayBuilder<kj::String> local_50;
  EncodingResult<kj::String> utf8;
  
  decodeWideString(&utf8,text);
  this = (Path *)utf8.super_String.content.ptr;
  if (utf8.super_String.content.size_ == 0) {
    this = (Path *)0x514074;
  }
  path.content.ptr =
       (char *)(utf8.super_String.content.size_ + (utf8.super_String.content.size_ == 0));
  path.content.size_ = extraout_RDX;
  count = countPartsWin32(this,path);
  local_50.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(count);
  local_50.endPtr = local_50.ptr + count;
  local_50.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  if (utf8.super_String.content.size_ == 0) {
    utf8.super_String.content.ptr = "";
  }
  path_00.content.ptr =
       (char *)(utf8.super_String.content.size_ + (utf8.super_String.content.size_ == 0));
  path_00.content.size_ = 1;
  local_50.pos = local_50.ptr;
  evalWin32Impl(__return_storage_ptr__,(Path *)&local_50,
                (Vector<kj::String> *)utf8.super_String.content.ptr,path_00,(bool)in_R9B);
  ArrayBuilder<kj::String>::dispose(&local_50);
  Array<char>::~Array((Array<char> *)&utf8);
  return __return_storage_ptr__;
}

Assistant:

Path Path::parseWin32Api(ArrayPtr<const wchar_t> text) {
  auto utf8 = decodeWideString(text);
  return evalWin32Impl(Vector<String>(countPartsWin32(utf8)), utf8, true);
}